

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::stringDefn(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  NoViableAltException *in_RDI;
  ParserException *ex;
  RefAST tmp81_AST;
  RefAST tmp80_AST;
  RefAST tmp79_AST;
  RefAST tmp78_AST;
  RefAST stringDefn_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe80;
  BitSet *in_stack_fffffffffffffe88;
  RefToken *other;
  ASTPair *in_stack_fffffffffffffe90;
  RefCount<AST> *in_stack_fffffffffffffe98;
  RefToken *in_stack_fffffffffffffea0;
  RefToken *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ASTPair *in_stack_fffffffffffffec8;
  ASTPair *currentAST_00;
  ASTFactory *in_stack_fffffffffffffed0;
  ASTFactory *this_00;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [39];
  undefined1 local_a9;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [8];
  GrpParser *in_stack_ffffffffffffffc0;
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ASTPair::ASTPair(in_stack_fffffffffffffe90);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
  iVar2 = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                    (in_RDI,1);
  if (iVar2 == 6) {
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
              (local_70,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
    this_00 = (ASTFactory *)&in_RDI->token;
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    ASTFactory::addASTChild
              (this_00,in_stack_fffffffffffffec8,
               (RefAST *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebc);
    stringDefn(in_stack_fffffffffffffff0);
    currentAST_00 = (ASTPair *)&in_RDI->token;
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    ASTFactory::addASTChild
              (this_00,currentAST_00,
               (RefAST *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    while( true ) {
      uVar3 = (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                        (in_RDI,1);
      bVar1 = BitSet::member(in_stack_fffffffffffffe88,
                             (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
      in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
      if (!bVar1) break;
      in_stack_fffffffffffffebc =
           (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x20))
                     (in_RDI,1);
      in_stack_fffffffffffffeb0 = (RefToken *)(ulong)(in_stack_fffffffffffffebc - 6);
      switch(in_stack_fffffffffffffeb0) {
      case (RefToken *)0x0:
      case (RefToken *)0xe:
      case (RefToken *)0x10:
        break;
      default:
        local_a9 = 1;
        uVar4 = __cxa_allocate_exception(0x40);
        (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                  (local_a8,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_RDI,(RefToken *)CONCAT44(iVar2,in_stack_fffffffffffffef8));
        local_a9 = 0;
        __cxa_throw(uVar4,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      case (RefToken *)0xf:
        RefCount<AST>::RefCount
                  (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
        (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                  (local_98,in_RDI,1);
        ASTFactory::create((ASTFactory *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0);
        RefCount<AST>::operator=
                  ((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
        RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffea0 = &in_RDI->token;
        RefCount<AST>::RefCount
                  (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
        ASTFactory::addASTChild
                  (this_00,currentAST_00,(RefAST *)CONCAT44(uVar3,in_stack_fffffffffffffec0));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
        Parser::match((Parser *)CONCAT44(uVar3,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc)
        ;
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
      }
      stringDefn(in_stack_fffffffffffffff0);
      in_stack_fffffffffffffe90 = (ASTPair *)&in_RDI->token;
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffffe90,
                 (RefCount<AST> *)in_stack_fffffffffffffe88);
      ASTFactory::addASTChild
                (this_00,currentAST_00,(RefAST *)CONCAT44(uVar3,in_stack_fffffffffffffec0));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    }
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    other = &in_RDI->token;
    (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
              (local_d0,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe80 = (ASTPair *)&in_RDI->token;
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->root,(RefCount<AST> *)other);
    ASTFactory::addASTChild
              (this_00,currentAST_00,(RefAST *)CONCAT44(uVar3,in_stack_fffffffffffffec0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    Parser::match((Parser *)CONCAT44(uVar3,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  }
  else if (iVar2 == 0x14) {
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
              (local_48,in_RDI,1);
    ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (RefAST *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebc);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  }
  else {
    if (iVar2 != 0x16) {
      uVar4 = __cxa_allocate_exception(0x40);
      (**(code **)(*(long *)&(in_RDI->super_ParserException).super_ANTLRException + 0x28))
                (local_e0,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_RDI,(RefToken *)CONCAT44(iVar2,in_stack_fffffffffffffef8));
      __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    stringFunc(in_stack_ffffffffffffffc0);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe90->root,(RefCount<AST> *)in_stack_fffffffffffffe88);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (RefAST *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  }
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffe80);
  return;
}

Assistant:

void GrpParser::stringDefn() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST stringDefn_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp78_AST = nullAST;
			tmp78_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp78_AST);
			match(LIT_STRING);
			break;
		}
		case LITERAL_string:
		{
			stringFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp79_AST = nullAST;
			tmp79_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp79_AST);
			match(OP_LPAREN);
			stringDefn();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_19.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp80_AST = nullAST;
						tmp80_AST = astFactory.create(LT(1));
						astFactory.addASTChild(currentAST, tmp80_AST);
						match(OP_COMMA);
						break;
					}
					case OP_LPAREN:
					case LIT_STRING:
					case LITERAL_string:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					stringDefn();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop57;
				}
				
			} while (true);
			_loop57:;
			}
			RefAST tmp81_AST = nullAST;
			tmp81_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp81_AST);
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		stringDefn_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_20);
	}
	returnAST = stringDefn_AST;
}